

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O2

double __thiscall MotionTrajectory::CalculateNextTime(MotionTrajectory *this,int *curDir)

{
  int *piVar1;
  double dVar2;
  MotionBase *pMVar3;
  ostream *poVar4;
  pointer ppMVar5;
  ulong uVar6;
  double extraout_XMM0_Qa;
  double dVar7;
  double extraout_XMM0_Qa_00;
  double dVar8;
  
  pMVar3 = (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>.
           _M_impl.super__Vector_impl_data._M_start[this->curIndex];
  piVar1 = &this->pos;
  (*pMVar3->_vptr_MotionBase[2])(this->tCur,pMVar3,piVar1,curDir);
  dVar8 = extraout_XMM0_Qa;
  while (dVar8 < 0.0) {
    uVar6 = this->curIndex;
    ppMVar5 = (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (((long)(this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>.
               _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar5 >> 3) - 1U <= uVar6) break;
    dVar8 = ppMVar5[uVar6]->tf;
    dVar2 = ppMVar5[uVar6]->pf;
    dVar7 = this->tCur;
    if (this->tCur < dVar8) {
      this->tCur = dVar8;
      dVar7 = dVar8;
    }
    dVar8 = 0.999999999;
    if (*curDir != -1) {
      dVar8 = 0.0;
    }
    if (*piVar1 != (int)(dVar8 + dVar2)) {
      poVar4 = std::operator<<((ostream *)&std::cout,"CalculateNextTime: pos = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->pos);
      std::operator<<(poVar4,", pf = ");
      poVar4 = std::ostream::_M_insert<double>(dVar2);
      poVar4 = std::operator<<(poVar4,", dir = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*curDir);
      std::endl<char,std::char_traits<char>>(poVar4);
      ppMVar5 = (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar6 = this->curIndex;
      dVar7 = this->tCur;
    }
    this->curIndex = uVar6 + 1;
    (*ppMVar5[uVar6 + 1]->_vptr_MotionBase[2])(dVar7,ppMVar5[uVar6 + 1],piVar1,curDir);
    dVar8 = extraout_XMM0_Qa_00;
  }
  if (0.0 <= dVar8) {
    this->tCur = dVar8;
  }
  return dVar8;
}

Assistant:

double MotionTrajectory::CalculateNextTime(int &curDir)
{
    double t = motionList[curIndex]->CalculateNextTime(tCur, pos, curDir);
    while ((t < 0.0) && (curIndex < motionList.size()-1)) {
        double tf, pf, vf, af;
        motionList[curIndex]->GetFinalValues(tf, pf, vf, af);
        if (tCur < tf)
            tCur = tf;
        int endPos = static_cast<int>(pf + ((curDir == -1) ? (1-TINY) : 0));
        if (pos != endPos)
            std::cout << "CalculateNextTime: pos = " << pos << ", pf = " << pf << ", dir = " << curDir << std::endl;
        curIndex++;
        t = motionList[curIndex]->CalculateNextTime(tCur, pos, curDir);
    }
    if (t >= 0.0)
        tCur = t;
    return t;
}